

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_rescale_enc.c
# Opt level: O0

int WebPPictureView(WebPPicture *src,int left,int top,int width,int height,WebPPicture *dst)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  WebPPicture *in_RDI;
  int in_R8D;
  WebPPicture *in_R9;
  int local_4;
  
  if ((in_RDI == (WebPPicture *)0x0) || (in_R9 == (WebPPicture *)0x0)) {
    local_4 = 0;
  }
  else {
    iVar1 = AdjustAndCheckRectangle
                      ((WebPPicture *)CONCAT44(in_ESI,in_EDX),(int *)CONCAT44(in_ECX,in_R8D),
                       &in_R9->use_argb,0,0x15b887);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      if (in_RDI != in_R9) {
        PictureGrabSpecs((WebPPicture *)CONCAT44(in_ECX,in_R8D),in_R9);
      }
      in_R9->width = in_ECX;
      in_R9->height = in_R8D;
      if (in_RDI->use_argb == 0) {
        in_R9->y = in_RDI->y + (long)in_ESI + (long)(in_EDX * in_RDI->y_stride);
        in_R9->u = in_RDI->u + (long)(in_ESI >> 1) + (long)((in_EDX >> 1) * in_RDI->uv_stride);
        in_R9->v = in_RDI->v + (long)(in_ESI >> 1) + (long)((in_EDX >> 1) * in_RDI->uv_stride);
        in_R9->y_stride = in_RDI->y_stride;
        in_R9->uv_stride = in_RDI->uv_stride;
        if (in_RDI->a != (uint8_t *)0x0) {
          in_R9->a = in_RDI->a + (long)in_ESI + (long)(in_EDX * in_RDI->a_stride);
          in_R9->a_stride = in_RDI->a_stride;
        }
      }
      else {
        in_R9->argb = in_RDI->argb + (long)(in_EDX * in_RDI->argb_stride) + (long)in_ESI;
        in_R9->argb_stride = in_RDI->argb_stride;
      }
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int WebPPictureView(const WebPPicture* src,
                    int left, int top, int width, int height,
                    WebPPicture* dst) {
  if (src == NULL || dst == NULL) return 0;

  // verify rectangle position.
  if (!AdjustAndCheckRectangle(src, &left, &top, width, height)) return 0;

  if (src != dst) {  // beware of aliasing! We don't want to leak 'memory_'.
    PictureGrabSpecs(src, dst);
  }
  dst->width = width;
  dst->height = height;
  if (!src->use_argb) {
    dst->y = src->y + top * src->y_stride + left;
    dst->u = src->u + (top >> 1) * src->uv_stride + (left >> 1);
    dst->v = src->v + (top >> 1) * src->uv_stride + (left >> 1);
    dst->y_stride = src->y_stride;
    dst->uv_stride = src->uv_stride;
    if (src->a != NULL) {
      dst->a = src->a + top * src->a_stride + left;
      dst->a_stride = src->a_stride;
    }
  } else {
    dst->argb = src->argb + top * src->argb_stride + left;
    dst->argb_stride = src->argb_stride;
  }
  return 1;
}